

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O2

void dctInverse8x8_sse2_6(float *data)

{
  dctInverse8x8_sse2(data,6);
  return;
}

Assistant:

static void
dctInverse8x8_sse2_6 (float* data)
{
    dctInverse8x8_sse2 (data, 6);
}